

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

bool __thiscall EventLoop::updateSocket(EventLoop *this,int fd,uint mode)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  FILE *__stream;
  int iVar3;
  uint *puVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  epoll_event local_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mMutex);
  if (iVar3 == 0) {
    p_Var1 = &(this->mSockets)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->mSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < fd]) {
      if (fd <= (int)p_Var6[1]._M_color) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, fd < (int)p_Var5[1]._M_color)) {
      p_Var6 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      bVar7 = false;
      fprintf(_stderr,"Unable to find socket to update %d\n",fd);
    }
    else {
      *(uint *)&p_Var6[1]._M_parent = mode;
      local_60.data.fd = 0;
      local_60.events = (mode & 0xfffffff0) * 0x8000000 + (mode & 1) + 0x80002000;
      if ((mode & 2) != 0) {
        local_60.events = local_60.events | 4;
      }
      if ((mode & 4) != 0) {
        local_60.events = local_60.events | 0x40000000;
      }
      local_60._4_4_ = fd;
      iVar3 = epoll_ctl(this->mPollFd,3,fd,&local_60);
      bVar7 = true;
      if (iVar3 == -1) {
        puVar4 = (uint *)__errno_location();
        __stream = _stderr;
        uVar2 = *puVar4;
        if ((uVar2 != 2) && (uVar2 != 0x11)) {
          Rct::strerror((Rct *)local_50,*puVar4);
          fprintf(__stream,"Unable to register socket %d with mode %x: %d (%s)\n",fd,(ulong)mode,
                  (ulong)uVar2,local_50[0]);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          bVar7 = false;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
    return bVar7;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool EventLoop::updateSocket(int fd, unsigned int mode)
{
    std::lock_guard<std::mutex> locker(mMutex);
    auto socket = mSockets.find(fd);
    if (socket == mSockets.end()) {
        fprintf(stderr, "Unable to find socket to update %d\n", fd);
        return false;
    }
#if defined(HAVE_KQUEUE)
    const int oldMode = socket->second.first;
#endif
    socket->second.first = mode;

    int e;
#if defined(HAVE_EPOLL)
    epoll_event ev;
    memset(&ev, 0, sizeof(ev));
    ev.events = EPOLLRDHUP;
    if (!(mode & SocketLevelTriggered))
        ev.events |= EPOLLET;
    if (mode & SocketRead)
        ev.events |= EPOLLIN;
    if (mode & SocketWrite)
        ev.events |= EPOLLOUT;
    if (mode & SocketOneShot)
        ev.events |= EPOLLONESHOT;
    ev.data.fd = fd;
    e = epoll_ctl(mPollFd, EPOLL_CTL_MOD, fd, &ev);
#elif defined(HAVE_KQUEUE)
    e = 0;
    const struct { int rf; int kf; } flags[] = {
        { SocketRead, EVFILT_READ },
        { SocketWrite, EVFILT_WRITE },
        { 0, 0 }
    };
    for (int i = 0; flags[i].rf; ++i) {
        if (!(mode & flags[i].rf) && !(oldMode & flags[i].rf))
            continue;
        struct kevent ev;
        memset(&ev, '\0', sizeof(struct kevent));
        ev.ident = fd;
        if (mode & flags[i].rf) {
            ev.flags = EV_ADD|EV_ENABLE;
            if (mode & SocketOneShot)
                ev.flags |= EV_ONESHOT;
        } else {
            assert(oldMode & flags[i].rf);
            ev.flags = EV_DELETE|EV_DISABLE;
        }
        ev.filter = flags[i].kf;
        eintrwrap(e, kevent(mPollFd, &ev, 1, 0, 0, 0));
    }
#elif defined(HAVE_SELECT)
    e = 0; // fake ok
    wakeup();
#endif
    if (e == -1) {
        if (errno != EEXIST && errno != ENOENT) {
            fprintf(stderr, "Unable to register socket %d with mode %x: %d (%s)\n",
                    fd, mode, errno, Rct::strerror().constData());
            return false;
        }
    }
    return true;
}